

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O2

void __thiscall chrono::ChSolverADMM::ChSolverADMM(ChSolverADMM *this)

{
  __shared_ptr<chrono::ChSolverSparseQR,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChIterativeSolverVI::ChIterativeSolverVI(&this->super_ChIterativeSolverVI);
  (this->super_ChIterativeSolverVI).super_ChIterativeSolver._vptr_ChIterativeSolver =
       (_func_int **)&PTR__ChSolverADMM_01186520;
  (this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver._vptr_ChSolver =
       (_func_int **)&PTR__ChSolverADMM_01186588;
  this->r_prim = 0.0;
  this->r_dual = 0.0;
  this->precond = false;
  this->rho = 0.1;
  this->rho_b = 1e-09;
  this->sigma = 1e-06;
  this->stepadjust_each = 5;
  this->stepadjust_threshold = 1.5;
  this->stepadjust_maxfactor = 50.0;
  this->stepadjust_type = BALANCED_FAST;
  this->tol_prim = 1e-06;
  this->tol_dual = 1e-06;
  this->acceleration = BASIC;
  (this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<chrono::ChSolverSparseQR>();
  std::__shared_ptr<chrono::ChDirectSolverLS,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChDirectSolverLS,(__gnu_cxx::_Lock_policy)2> *)&this->LS_solver,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChSolverADMM::ChSolverADMM() :
        r_prim(0),
        r_dual(0),
        precond(false),
        rho(0.1),
        rho_b(1e-9),
        sigma(1e-6),
        stepadjust_each(5),
        stepadjust_threshold(1.5),
        stepadjust_maxfactor(50),
        stepadjust_type(AdmmStepType::BALANCED_FAST),
        tol_prim(1e-6),
        tol_dual(1e-6),
        acceleration(AdmmAcceleration::BASIC)
{
    LS_solver = chrono_types::make_shared<ChSolverSparseQR>();
}